

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResponseBase.h
# Opt level: O3

set<Token,_std::less<Token>,_std::allocator<Token>_> * __thiscall
ResponseBase::extractStdTokensFromLine
          (set<Token,_std::less<Token>,_std::allocator<Token>_> *__return_storage_ptr__,
          ResponseBase *this,string *line)

{
  _Rb_tree_header *p_Var1;
  ulong uVar2;
  ulong uVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  char cVar5;
  pointer pcVar6;
  int iVar7;
  long lVar8;
  size_type sVar9;
  ulong uVar10;
  string tokenValue;
  set<Token,_std::less<Token>,_std::allocator<Token>_> subSet;
  string local_b0;
  string local_90;
  ResponseBase *local_70;
  long local_68;
  undefined1 local_60 [48];
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_70 = this;
  lVar8 = std::__cxx11::string::find((char *)line,0x175f06,0);
  do {
    local_68 = lVar8;
    if (local_68 == -1) {
      return __return_storage_ptr__;
    }
    uVar10 = local_68 + 5;
    sVar9 = line->_M_string_length;
    while (uVar10 < sVar9) {
      pcVar6 = (line->_M_dataplus)._M_p;
      cVar5 = pcVar6[uVar10];
      iVar7 = isalnum((int)cVar5);
      if (iVar7 == 0) {
        if (cVar5 == ':') {
          if ((sVar9 <= uVar10 + 1) || (pcVar6[uVar10 + 1] != ':')) break;
          uVar10 = uVar10 + 2;
        }
        else {
          if (cVar5 != '<') {
            if (cVar5 == '_') goto LAB_0014c95e;
            break;
          }
          uVar2 = uVar10 + 1;
          if (sVar9 <= uVar2) break;
          iVar7 = 1;
          lVar8 = 0;
          do {
            iVar7 = (iVar7 + (uint)(pcVar6[lVar8 + uVar2] == '<')) -
                    (uint)(pcVar6[lVar8 + uVar2] == '>');
            uVar3 = uVar10 + 2 + lVar8;
            lVar8 = lVar8 + 1;
            if (sVar9 <= uVar3) break;
          } while (iVar7 != 0);
          if (iVar7 != 0) break;
          std::__cxx11::string::substr((ulong)&local_b0,(ulong)line);
          extractStdTokensFromLine
                    ((set<Token,_std::less<Token>,_std::allocator<Token>_> *)local_60,local_70,
                     &local_b0);
          std::_Rb_tree<Token,Token,std::_Identity<Token>,std::less<Token>,std::allocator<Token>>::
          _M_insert_range_unique<std::move_iterator<std::_Rb_tree_const_iterator<Token>>>
                    ((_Rb_tree<Token,Token,std::_Identity<Token>,std::less<Token>,std::allocator<Token>>
                      *)__return_storage_ptr__,
                     (move_iterator<std::_Rb_tree_const_iterator<Token>_>)local_60._24_8_,
                     (move_iterator<std::_Rb_tree_const_iterator<Token>_>)((long)local_60 + 8));
          std::
          _Rb_tree<Token,_Token,_std::_Identity<Token>,_std::less<Token>,_std::allocator<Token>_>::
          ~_Rb_tree((_Rb_tree<Token,_Token,_std::_Identity<Token>,_std::less<Token>,_std::allocator<Token>_>
                     *)local_60);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,
                            CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                                     local_b0.field_2._M_local_buf[0]) + 1);
          }
          uVar10 = uVar2 + lVar8;
          sVar9 = line->_M_string_length;
        }
      }
      else {
LAB_0014c95e:
        uVar10 = uVar10 + 1;
      }
    }
    std::__cxx11::string::substr((ulong)&local_b0,(ulong)line);
    paVar4 = &local_b0.field_2;
    if (local_b0._M_dataplus._M_p[local_b0._M_string_length - 1] != ':') {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p == paVar4) {
        local_90.field_2._8_8_ = local_b0.field_2._8_8_;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      }
      else {
        local_90._M_dataplus._M_p = local_b0._M_dataplus._M_p;
      }
      local_90.field_2._M_allocated_capacity._1_7_ = local_b0.field_2._M_allocated_capacity._1_7_;
      local_90.field_2._M_local_buf[0] = local_b0.field_2._M_local_buf[0];
      local_90._M_string_length = local_b0._M_string_length;
      local_b0._M_string_length = 0;
      local_b0.field_2._M_local_buf[0] = '\0';
      local_b0._M_dataplus._M_p = (pointer)paVar4;
      Token::Token((Token *)local_60,&local_90);
      std::_Rb_tree<Token,_Token,_std::_Identity<Token>,_std::less<Token>,_std::allocator<Token>_>::
      _M_insert_unique<Token>(&__return_storage_ptr__->_M_t,(Token *)local_60);
      if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
        operator_delete((void *)local_60._0_8_,(ulong)(local_60._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
    lVar8 = std::__cxx11::string::find((char *)line,0x175f06,uVar10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar4) {
      operator_delete(local_b0._M_dataplus._M_p,
                      CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                               local_b0.field_2._M_local_buf[0]) + 1);
    }
  } while( true );
}

Assistant:

std::set<Token> extractStdTokensFromLine(const std::string& line) const {
        const std::string_view tokenStartString = "std::";

        std::set<Token> tokens;

        size_t tokenBegin = line.find(tokenStartString);
        while (tokenBegin != std::string::npos) {
            size_t tokenEnd = tokenBegin + tokenStartString.length();

            while (tokenEnd < line.length()) {
                if (std::isalnum(line[tokenEnd])) {
                    tokenEnd++;
                } else if (line[tokenEnd] == '_') {
                    tokenEnd++;
                } else if ((line[tokenEnd] == ':') and (tokenEnd + 1 < line.length()) and (line[tokenEnd + 1] == ':')) {
                    tokenEnd += 2;
                } else if (line[tokenEnd] == '<') {
                    const size_t templateEnd = braceEnd(line, tokenEnd, '<', '>');
                    if (templateEnd == std::string::npos) {
                        break;
                    }

                    const std::string templateContent = line.substr(tokenEnd + 1, templateEnd - tokenEnd);
                    std::set<Token> subSet = extractStdTokensFromLine(templateContent);
                    moveInsert(std::move(subSet), tokens);
                    tokenEnd = templateEnd + 1;
                } else {
                    break;
                }
            }

            std::string tokenValue = line.substr(tokenBegin, tokenEnd - tokenBegin);
            if (tokenValue.back() != ':') {
                tokens.insert(Token(std::move(tokenValue)));
            }

            tokenBegin = line.find(tokenStartString, tokenEnd);
        }

        return tokens;
    }